

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cpp
# Opt level: O0

vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *
lookup(vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *__return_storage_ptr__,
      string_view symbol,Search_type st)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<Symbol_lib_entry> __l;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  _Ios_Openmode _Var2;
  uintmax_t uVar3;
  uint *puVar4;
  char *pcVar5;
  uint *puVar6;
  size_type sVar7;
  size_type sVar8;
  string_view sVar9;
  Symbol_lib_entry *local_428;
  Symbol_lib_entry local_3b8;
  size_t local_380;
  size_t local_378;
  string_view local_370;
  undefined1 local_35a;
  allocator<Symbol_lib_entry> local_359;
  Symbol_lib_entry local_358;
  Symbol_lib_entry *local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_310;
  string_view local_300;
  undefined1 local_2f0 [8];
  Symbol_lib_entry value;
  File_content_iterator local_2b0;
  File_content_iterator local_2a8;
  File_content_iterator local_2a0;
  File_content_iterator pos;
  uint *index_end;
  uint *index_begin;
  long lStack_280;
  RAII<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Toeger[P]LibFinder_lookup_cpp:130:2)>
  ON_SCOPE_EXIT_130;
  ifstream index_file;
  path local_68;
  uint local_44;
  undefined1 local_40 [4];
  File_index_t index_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  undefined1 auStack_20 [4];
  Search_type st_local;
  string_view symbol_local;
  vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_> *retval;
  
  symbol_local._M_len = (size_t)symbol._M_str;
  _auStack_20 = symbol._M_len;
  indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = st;
  symbol_local._M_str = (char *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  boost::filesystem::path::path(&local_68,&data_base_index_filepath_abi_cxx11_);
  uVar3 = boost::filesystem::file_size(&local_68);
  boost::filesystem::path::~path(&local_68);
  local_44 = (uint)uVar3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
             (ulong)((uint)uVar3 >> 2));
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream
            (&stack0xfffffffffffffd80,(string *)&data_base_index_filepath_abi_cxx11_,_Var2);
  puVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  pcVar5 = any_cast<char*,unsigned_int>(puVar4);
  std::istream::read((char *)&stack0xfffffffffffffd80,(long)pcVar5);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&stack0xfffffffffffffd80 + *(long *)(lStack_280 + -0x18)));
  if (!bVar1) {
    __assert_fail("index_file",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/lookup.cpp"
                  ,0x7f,"std::vector<Symbol_lib_entry> lookup(string_view, Search_type)");
  }
  std::ifstream::~ifstream(&stack0xfffffffffffffd80);
  std::operator|(_S_in,_S_bin);
  std::ifstream::open((string *)File_content_iterator::file,0x1959b0);
  create_RAII<lookup(std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>,Search_type)::__0>
            ((anon_class_1_0_00000001_for_f *)((long)&index_begin + 7));
  puVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  puVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  pos.file_position = puVar6 + sVar7;
  File_content_iterator::File_content_iterator(&local_2a8,puVar4);
  File_content_iterator::File_content_iterator(&local_2b0,pos.file_position);
  local_2a0 = std::
              lower_bound<File_content_iterator,std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>>
                        (local_2a8,local_2b0,
                         (basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  if (local_2a0.file_position == pos.file_position) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::vector(__return_storage_ptr__)
    ;
    value.lib_pos.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    File_content_iterator::get_element((Symbol_lib_entry *)local_2f0,&local_2a0);
    if (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == exact) {
      local_300 = Symbol_lib_entry::get_symbol((Symbol_lib_entry *)local_2f0);
      local_310._M_allocated_capacity = _auStack_20;
      local_310._8_8_ = symbol_local._M_len;
      __y._M_str = (char *)symbol_local._M_len;
      __y._M_len = _auStack_20;
      bVar1 = std::experimental::fundamentals_v1::operator==(local_300,__y);
      if (bVar1) {
        Symbol_lib_entry::Symbol_lib_entry(&local_358,(Symbol_lib_entry *)local_2f0);
        local_318 = 1;
        local_320 = &local_358;
        std::allocator<Symbol_lib_entry>::allocator(&local_359);
        __l._M_len = local_318;
        __l._M_array = local_320;
        std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::vector
                  (__return_storage_ptr__,__l,&local_359);
        std::allocator<Symbol_lib_entry>::~allocator(&local_359);
        local_428 = (Symbol_lib_entry *)&local_320;
        do {
          local_428 = local_428 + -1;
          Symbol_lib_entry::~Symbol_lib_entry(local_428);
        } while (local_428 != &local_358);
      }
      else {
        memset(__return_storage_ptr__,0,0x18);
        std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::vector
                  (__return_storage_ptr__);
      }
    }
    else {
      local_35a = 0;
      std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::vector
                (__return_storage_ptr__);
      while( true ) {
        sVar9 = Symbol_lib_entry::get_symbol((Symbol_lib_entry *)local_2f0);
        local_380 = _auStack_20;
        local_378 = symbol_local._M_len;
        __str._M_str = (char *)symbol_local._M_len;
        __str._M_len = _auStack_20;
        local_370 = sVar9;
        sVar8 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
                ::find(&local_370,__str,0);
        if (sVar8 != 0) break;
        std::vector<Symbol_lib_entry,_std::allocator<Symbol_lib_entry>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_2f0);
        File_content_iterator::operator++(&local_2a0);
        if (local_2a0.file_position == pos.file_position) break;
        File_content_iterator::get_element(&local_3b8,&local_2a0);
        Symbol_lib_entry::operator=((Symbol_lib_entry *)local_2f0,&local_3b8);
        Symbol_lib_entry::~Symbol_lib_entry(&local_3b8);
      }
      local_35a = 1;
    }
    value.lib_pos.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    Symbol_lib_entry::~Symbol_lib_entry((Symbol_lib_entry *)local_2f0);
  }
  RAII<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/lookup.cpp:130:2)>
  ::~RAII((RAII<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Toeger[P]LibFinder_lookup_cpp:130:2)>
           *)((long)&index_begin + 7));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Symbol_lib_entry> lookup(string_view symbol, Search_type st) {
	std::vector<File_index_t> indexes;
	{
		File_index_t index_size = boost::filesystem::file_size(data_base_index_filepath);
		indexes.resize(index_size / sizeof(File_index_t));
		std::ifstream index_file(data_base_index_filepath, std::ios_base::in | std::ios::binary);
		index_file.read(any_cast<char *>(indexes.data()), index_size);
		assert(index_file);
	}
	File_content_iterator::file.open(data_base_filepath, std::ios_base::in | std::ios::binary);
	ON_SCOPE_EXIT(File_content_iterator::file.close(););

	//TODO: replace lower_bound with binary_interpolation_search
	auto index_begin = indexes.data();
	auto index_end = indexes.data() + indexes.size();
	auto pos = std::lower_bound(File_content_iterator{index_begin}, File_content_iterator{index_end}, symbol);
	if (pos.file_position == index_end) {
		return {};
	};
	auto value = pos.get_element();
	if (st == Search_type::exact) {
		if (value.get_symbol() == symbol) {
			return {std::move(value)};
		};
		return {};
	}
	std::vector<Symbol_lib_entry> retval;
	while (value.get_symbol().find(symbol) == 0) {
		retval.push_back(std::move(value));
		++pos;
		if (pos.file_position == index_end) {
			return retval;
		}
		value = pos.get_element();
	}
	return retval;
}